

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<double,unsigned_long>
               (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  ulong uVar1;
  double dVar2;
  bool bVar3;
  unsigned_long ix;
  unsigned_long uVar4;
  double dVar5;
  double __x;
  double __x_00;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  uVar4 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if (uVar1 - uVar4 < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
    __x = 0.0;
    __x_00 = 0.0;
  }
  else {
    __x_00 = INFINITY;
    __x = -INFINITY;
  }
  if (missing_action == Fail) {
    for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      dVar5 = Xc[uVar4];
      dVar2 = dVar5;
      if (__x_00 <= dVar5) {
        dVar2 = __x_00;
      }
      __x_00 = dVar2;
      *xmin = __x_00;
      if (dVar5 <= __x) {
        dVar5 = __x;
      }
      *xmax = dVar5;
      __x = dVar5;
    }
  }
  else {
    for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      dVar5 = Xc[uVar4];
      if (ABS(dVar5) != INFINITY) {
        __x_00 = fmin(__x_00,dVar5);
        *xmin = __x_00;
        __x = fmax(__x,dVar5);
        *xmax = __x;
      }
    }
  }
  bVar3 = true;
  if (((__x_00 != __x) || (NAN(__x_00) || NAN(__x))) && (__x_00 != INFINITY || __x != -INFINITY)) {
    bVar3 = NAN(__x);
  }
  *unsplittable = bVar3;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}